

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pruned_grid.hpp
# Opt level: O0

spherical_grid_ptr __thiscall
IntegratorXX::detail::
make_pruned_grid_impl<IntegratorXX::Womersley<double>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
          (detail *this,
          RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>
          *rq,vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
              *pruning_regions)

{
  size_t idx;
  pointer this_00;
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  spherical_grid_ptr sVar2;
  Womersley<double> local_a0;
  reference local_70;
  PruningRegion *region;
  const_iterator __end2;
  const_iterator __begin2;
  vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_> *__range2;
  RadialGridPartition<IntegratorXX::Womersley<double>_> rgp;
  vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
  *pruning_regions_local;
  RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>
  *rq_local;
  
  rgp.quads_.
  super__Vector_base<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>,_std::allocator<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pruning_regions;
  RadialGridPartition<IntegratorXX::Womersley<double>_>::RadialGridPartition
            ((RadialGridPartition<IntegratorXX::Womersley<double>_> *)&__range2);
  this_00 = rgp.quads_.
            super__Vector_base<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>,_std::allocator<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2 = std::vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>::
           begin((vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>
                  *)rgp.quads_.
                    super__Vector_base<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>,_std::allocator<IntegratorXX::Quadrature<IntegratorXX::Womersley<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  region = (PruningRegion *)
           std::vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>::
           end((vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_> *)
               this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_IntegratorXX::PruningRegion_*,_std::vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>_>
                                *)&region);
    if (!bVar1) break;
    local_70 = __gnu_cxx::
               __normal_iterator<const_IntegratorXX::PruningRegion_*,_std::vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>_>
               ::operator*(&__end2);
    idx = local_70->idx_st;
    Womersley<double>::Womersley(&local_a0,local_70->angular_size);
    RadialGridPartition<IntegratorXX::Womersley<double>>::
    add_quad<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
              ((RadialGridPartition<IntegratorXX::Womersley<double>> *)&__range2,rq,idx,
               &local_a0.super_Quadrature<IntegratorXX::Womersley<double>_>);
    Womersley<double>::~Womersley(&local_a0);
    __gnu_cxx::
    __normal_iterator<const_IntegratorXX::PruningRegion_*,_std::vector<IntegratorXX::PruningRegion,_std::allocator<IntegratorXX::PruningRegion>_>_>
    ::operator++(&__end2);
  }
  RadialGridPartition<IntegratorXX::Womersley<double>>::
  finalize<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
            ((RadialGridPartition<IntegratorXX::Womersley<double>> *)&__range2,rq);
  SphericalGridFactory::
  generate_pruned_grid<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>const&,IntegratorXX::RadialGridPartition<IntegratorXX::Womersley<double>>>
            ((SphericalGridFactory *)this,rq,
             (RadialGridPartition<IntegratorXX::Womersley<double>_> *)&__range2);
  RadialGridPartition<IntegratorXX::Womersley<double>_>::~RadialGridPartition
            ((RadialGridPartition<IntegratorXX::Womersley<double>_> *)&__range2);
  sVar2.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (spherical_grid_ptr)
         sVar2.
         super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

auto make_pruned_grid_impl(const RadialQuadType& rq, 
  const std::vector<PruningRegion>& pruning_regions) {

  RadialGridPartition<AngularQuadType> rgp;
  for( auto& region : pruning_regions ) {
    rgp.add_quad( rq, region.idx_st, AngularQuadType(region.angular_size) );
  }
  rgp.finalize(rq);

  return SphericalGridFactory::generate_pruned_grid(rq, std::move(rgp));

}